

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O2

void tcp_dowrite(nni_tcp_conn *c)

{
  void *pvVar1;
  undefined8 uVar2;
  int __fd;
  nng_err result;
  nni_aio *aio;
  ssize_t sVar3;
  size_t count;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  iovec *piVar8;
  size_t local_f8;
  iovec iovec [8];
  msghdr hdr;
  nni_iov *aiov;
  uint naiov;
  
  __fd = nni_posix_pfd_fd(&c->pfd);
  if (c->closed == false) {
    do {
      while( true ) {
        aio = (nni_aio *)nni_list_first(&c->writeq);
        if (aio == (nni_aio *)0x0) {
          return;
        }
        nni_aio_get_iov(aio,(uint *)((long)&aiov + 4),(nni_iov **)&hdr.msg_flags);
        if (8 < aiov._4_4_) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_tcpconn.c"
                    ,0x30,"naiov <= NNI_AIO_MAX_IOV");
        }
        uVar2 = hdr._48_8_;
        hdr.msg_iovlen = 0;
        hdr.msg_control = (void *)0x0;
        iovec[7].iov_len = 0;
        hdr.msg_name = (void *)0x0;
        hdr.msg_controllen = 0;
        uVar5 = (ulong)aiov._4_4_;
        iVar7 = 0;
        for (lVar6 = 0; piVar8 = (iovec *)(long)iVar7, uVar5 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
          pvVar1 = *(void **)(uVar2 + 8 + lVar6);
          if (pvVar1 != (void *)0x0) {
            iovec[(long)piVar8].iov_base = pvVar1;
            iovec[(long)((long)&piVar8[-1].iov_len + 7)].iov_len = *(size_t *)(uVar2 + lVar6);
            iVar7 = iVar7 + 1;
          }
        }
        hdr._8_8_ = &local_f8;
        hdr.msg_iov = piVar8;
        sVar3 = sendmsg(__fd,(msghdr *)&iovec[7].iov_len,0x4000);
        if ((int)(uint)sVar3 < 0) break;
        nni_aio_bump_count(aio,(ulong)((uint)sVar3 & 0x7fffffff));
        nni_aio_list_remove(aio);
        count = nni_aio_count(aio);
        nni_aio_finish(aio,NNG_OK,count);
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if (*piVar4 != 0xb) {
      nni_aio_list_remove(aio);
      result = nni_plat_errno(*piVar4);
      nni_aio_finish_error(aio,result);
    }
  }
  return;
}

Assistant:

static void
tcp_dowrite(nni_tcp_conn *c)
{
	nni_aio *aio;
	int      fd = nni_posix_pfd_fd(&c->pfd);

	if (c->closed) {
		return;
	}

	while ((aio = nni_list_first(&c->writeq)) != NULL) {
		int      n;
		unsigned naiov;
		nni_iov *aiov;

		nni_aio_get_iov(aio, &naiov, &aiov);

		NNI_ASSERT(naiov <= NNI_AIO_MAX_IOV);

#ifdef NNG_HAVE_SENDMSG
		struct msghdr hdr = { 0 };
		struct iovec  iovec[NNI_AIO_MAX_IOV];
		int           niov;
		unsigned      i;
		for (niov = 0, i = 0; i < naiov; i++) {
			if (aiov[i].iov_len > 0) {
				iovec[niov].iov_len  = aiov[i].iov_len;
				iovec[niov].iov_base = aiov[i].iov_buf;
				niov++;
			}
		}

		hdr.msg_iovlen = niov;
		hdr.msg_iov    = iovec;

		n = sendmsg(fd, &hdr, MSG_NOSIGNAL);
#else
		// We have to send a bit at a time.
		n = send(fd, aiov[0].iov_buf, aiov[0].iov_len, MSG_NOSIGNAL);
#endif
		if (n < 0) {
			switch (errno) {
			case EINTR:
				continue;
			case EAGAIN:
#ifdef EWOULDBLOCK
#if EWOULDBLOCK != EAGAIN
			case EWOULDBLOCK:
#endif
#endif
				return;
			default:
				nni_aio_list_remove(aio);
				nni_aio_finish_error(
				    aio, nni_plat_errno(errno));
				return;
			}
		}

		nni_aio_bump_count(aio, n);
		nni_aio_list_remove(aio);
		nni_aio_finish(aio, 0, nni_aio_count(aio));

		// Go back to start of loop to see if there is another
		// aio ready for us to process.
	}
}